

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O2

void on_sasl_frame_received_callback(void *context,AMQP_VALUE sasl_frame)

{
  _Bool _Var1;
  int iVar2;
  AMQP_VALUE pAVar3;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  AMQP_VALUE descriptor;
  char *pcVar4;
  SASL_RESPONSE_HANDLE sasl_response;
  SASL_INIT_HANDLE sasl_init;
  uint32_t index;
  amqp_binary initial_response_value;
  amqp_binary response_value;
  char *in_stack_ffffffffffffff78;
  undefined4 uVar6;
  uint32_t mechanisms_count;
  undefined4 uStack_64;
  char *sasl_server_mechanism_name;
  uint32_t local_58;
  SASL_MECHANISMS_HANDLE sasl_mechanisms_handle;
  uint32_t local_48;
  AMQP_VALUE sasl_server_mechanisms;
  uint32_t local_38;
  uint32_t uVar5;
  
  uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  iVar2 = *(int *)((long)context + 0x68);
  if ((iVar2 - 3U < 2) || (iVar2 == 1)) goto LAB_00155bb9;
  if (iVar2 != 2) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
      return;
    }
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
               ,"on_sasl_frame_received_callback",0x28e,1,"SASL frame received while in state %d",
               CONCAT44(uVar6,*(undefined4 *)((long)context + 0x68)));
    return;
  }
  if (*(int *)((long)context + 0x48) != 4) goto LAB_00155bb9;
  pAVar3 = amqpvalue_get_inplace_descriptor(sasl_frame);
  if (pAVar3 == (AMQP_VALUE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_00155bb9;
    pcVar4 = "Could not obtain SASL frame descriptor";
    iVar2 = 0x2a4;
  }
  else {
    if ((((*(byte *)((long)context + 0x78) & 1) != 0) &&
        (UNRECOVERED_JUMPTABLE = xlogging_get_log_function(),
        UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0)) &&
       (descriptor = amqpvalue_get_inplace_descriptor(sasl_frame), descriptor != (AMQP_VALUE)0x0)) {
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_TRACE,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                   ,"log_incoming_frame",0x135,0,"<- ");
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
        in_stack_ffffffffffffff78 = get_frame_type_as_string(descriptor);
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_TRACE,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                   ,"log_incoming_frame",0x136,0,"%s",in_stack_ffffffffffffff78);
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = amqpvalue_to_string(sasl_frame);
        in_stack_ffffffffffffff78 = pcVar4;
        (*UNRECOVERED_JUMPTABLE)
                  (AZ_LOG_TRACE,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                   ,"log_incoming_frame",0x138,1,"%s",pcVar4);
      }
      free(pcVar4);
    }
    _Var1 = is_sasl_mechanisms_type_by_descriptor(pAVar3);
    if (_Var1) {
      if (*(int *)((long)context + 0x4c) == 1) {
        iVar2 = amqpvalue_get_sasl_mechanisms(sasl_frame,&sasl_mechanisms_handle);
        if (iVar2 != 0) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001557d2;
          pcVar4 = "Could not get SASL mechanisms";
          iVar2 = 0x2c1;
          goto LAB_001557cd;
        }
        iVar2 = sasl_mechanisms_get_sasl_server_mechanisms
                          (sasl_mechanisms_handle,&sasl_server_mechanisms);
        if (((iVar2 == 0) &&
            (iVar2 = amqpvalue_get_array_item_count(sasl_server_mechanisms,&mechanisms_count),
            iVar2 == 0)) && (mechanisms_count != 0)) {
          pcVar4 = saslmechanism_get_mechanism_name
                             (*(SASL_MECHANISM_HANDLE *)((long)context + 0x70));
          if (pcVar4 == (char *)0x0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar4 = "Cannot get the mechanism name";
              iVar2 = 0x2d7;
              goto LAB_00155867;
            }
          }
          else {
            index = 0;
            while (index < mechanisms_count) {
              pAVar3 = amqpvalue_get_array_item(sasl_server_mechanisms,index);
              if (pAVar3 == (AMQP_VALUE)0x0) {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                uVar5 = mechanisms_count;
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  in_stack_ffffffffffffff78 =
                       (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),index);
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                             ,"on_sasl_frame_received_callback",0x2e4,1,
                             "Cannot get SASL mechanisms array item for index %u",
                             in_stack_ffffffffffffff78);
                  uVar5 = mechanisms_count;
                }
              }
              else {
                iVar2 = amqpvalue_get_symbol(pAVar3,&sasl_server_mechanism_name);
                if (iVar2 == 0) {
                  iVar2 = strcmp(pcVar4,sasl_server_mechanism_name);
                  if (iVar2 == 0) {
                    amqpvalue_destroy(pAVar3);
                    break;
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  index = mechanisms_count;
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                               ,"on_sasl_frame_received_callback",0x2ec,1,
                               "Error getting server SASL mechanism from array item");
                    index = mechanisms_count;
                  }
                }
                amqpvalue_destroy(pAVar3);
                uVar5 = index;
              }
              index = uVar5 + 1;
            }
            if (index == mechanisms_count) {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar4 = "Could not find desired SASL mechanism in the list presented by server";
                iVar2 = 0x2ff;
                goto LAB_00155867;
              }
            }
            else {
              *(undefined4 *)((long)context + 0x4c) = 2;
              local_58 = 0;
              sasl_server_mechanism_name = (char *)0x0;
              sasl_init = sasl_init_create(pcVar4);
              if (sasl_init == (SASL_INIT_HANDLE)0x0) {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                             ,"send_sasl_init",0x212,1,"Could not create sasl_init");
                }
              }
              else {
                iVar2 = saslmechanism_get_init_bytes
                                  (*(SASL_MECHANISM_HANDLE *)((long)context + 0x70),
                                   (SASL_MECHANISM_BYTES *)&sasl_server_mechanism_name);
                if (iVar2 == 0) {
                  if ((local_58 == 0) ||
                     (initial_response_value.length = local_58,
                     initial_response_value.bytes = sasl_server_mechanism_name,
                     initial_response_value._12_4_ = 0,
                     iVar2 = sasl_init_set_initial_response(sasl_init,initial_response_value),
                     iVar2 == 0)) {
                    pAVar3 = amqpvalue_create_sasl_init(sasl_init);
                    if (pAVar3 != (AMQP_VALUE)0x0) {
                      iVar2 = sasl_frame_codec_encode_frame
                                        (*(SASL_FRAME_CODEC_HANDLE *)((long)context + 0x58),pAVar3,
                                         on_bytes_encoded,context);
                      if (iVar2 == 0) {
                        if ((*(byte *)((long)context + 0x78) & 1) != 0) {
                          log_outgoing_frame(pAVar3);
                        }
                      }
                      else {
                        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                        if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                          (*UNRECOVERED_JUMPTABLE)
                                    (AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                                     ,"send_sasl_init",0x23a,1,"Could not encode SASL init value");
                        }
                      }
                      amqpvalue_destroy(pAVar3);
                      sasl_init_destroy(sasl_init);
                      if (iVar2 == 0) {
                        *(undefined4 *)((long)context + 0x4c) = 3;
                        goto LAB_00155874;
                      }
                      goto LAB_00155e73;
                    }
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      pcVar4 = "Could not create SASL init";
                      iVar2 = 0x231;
                      goto LAB_00155e32;
                    }
                  }
                  else {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      pcVar4 = "Could not set initial response";
                      iVar2 = 0x228;
                      goto LAB_00155e32;
                    }
                  }
                }
                else {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    pcVar4 = "Could not get SASL init bytes";
                    iVar2 = 0x21b;
LAB_00155e32:
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                               ,"send_sasl_init",iVar2,1,pcVar4);
                  }
                }
                sasl_init_destroy(sasl_init);
              }
LAB_00155e73:
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar4 = "Could not send SASL init";
                iVar2 = 0x30c;
LAB_00155867:
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                           ,"on_sasl_frame_received_callback",iVar2,1,pcVar4);
              }
            }
          }
        }
        else {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
            pcVar4 = "Invalid SASL mechanisms list";
            iVar2 = 0x2ce;
            goto LAB_00155867;
          }
        }
        handle_error((SASL_CLIENT_IO_INSTANCE *)context);
LAB_00155874:
        sasl_mechanisms_destroy(sasl_mechanisms_handle);
        return;
      }
      UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
      if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_00155bb9;
      pcVar4 = "SASL mechanisms frame received in %s%s (%d) state";
      iVar2 = 0x2b6;
    }
    else {
      _Var1 = is_sasl_challenge_type_by_descriptor(pAVar3);
      if (_Var1) {
        if ((*(int *)((long)context + 0x4c) == 3) || (*(int *)((long)context + 0x4c) == 5)) {
          iVar2 = amqpvalue_get_sasl_challenge
                            (sasl_frame,(SASL_CHALLENGE_HANDLE *)&mechanisms_count);
          if (iVar2 != 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001557d2;
            pcVar4 = "Cannot get SASL challenge values";
            iVar2 = 0x331;
            goto LAB_001557cd;
          }
          sasl_server_mechanism_name = (char *)0x0;
          local_58 = 0;
          iVar2 = sasl_challenge_get_challenge
                            ((SASL_CHALLENGE_HANDLE)CONCAT44(uStack_64,mechanisms_count),
                             (amqp_binary *)&sasl_server_mechanism_name);
          if (iVar2 == 0) {
            sasl_mechanisms_handle = (SASL_MECHANISMS_HANDLE)sasl_server_mechanism_name;
            local_48 = local_58;
            sasl_server_mechanisms = (AMQP_VALUE)0x0;
            local_38 = 0;
            iVar2 = saslmechanism_challenge
                              (*(SASL_MECHANISM_HANDLE *)((long)context + 0x70),
                               (SASL_MECHANISM_BYTES *)&sasl_mechanisms_handle,
                               (SASL_MECHANISM_BYTES *)&sasl_server_mechanisms);
            if (iVar2 == 0) {
              response_value.length = local_38;
              response_value.bytes = sasl_server_mechanisms;
              response_value._12_4_ = 0;
              sasl_response = sasl_response_create(response_value);
              if (sasl_response == (SASL_RESPONSE_HANDLE)0x0) {
                UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                  (*UNRECOVERED_JUMPTABLE)
                            (AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                             ,"send_sasl_response",0x260,1,"Could not create SASL response");
                }
              }
              else {
                pAVar3 = amqpvalue_create_sasl_response(sasl_response);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                    (*UNRECOVERED_JUMPTABLE)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                               ,"send_sasl_response",0x268,1,
                               "Could not create SASL response AMQP value");
                  }
                  sasl_response_destroy(sasl_response);
                }
                else {
                  iVar2 = sasl_frame_codec_encode_frame
                                    (*(SASL_FRAME_CODEC_HANDLE *)((long)context + 0x58),pAVar3,
                                     on_bytes_encoded,context);
                  if (iVar2 == 0) {
                    if ((*(byte *)((long)context + 0x78) & 1) != 0) {
                      log_outgoing_frame(pAVar3);
                    }
                  }
                  else {
                    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
                    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                      (*UNRECOVERED_JUMPTABLE)
                                (AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                                 ,"send_sasl_response",0x270,1,
                                 "Could not encode SASL response in the frame");
                    }
                  }
                  amqpvalue_destroy(pAVar3);
                  sasl_response_destroy(sasl_response);
                  if (iVar2 == 0) goto LAB_00155f05;
                }
              }
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar4 = "Cannot send SASL response";
                iVar2 = 0x357;
LAB_00155ef8:
                (*UNRECOVERED_JUMPTABLE)
                          (AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                           ,"on_sasl_frame_received_callback",iVar2,1,pcVar4);
              }
            }
            else {
              UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
              if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
                pcVar4 = "SASL Challenge failed";
                iVar2 = 0x351;
                goto LAB_00155ef8;
              }
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar4 = "Cannot get SASL challenge binary value";
              iVar2 = 0x33f;
              goto LAB_00155ef8;
            }
          }
          handle_error((SASL_CLIENT_IO_INSTANCE *)context);
LAB_00155f05:
          sasl_challenge_destroy((SASL_CHALLENGE_HANDLE)CONCAT44(uStack_64,mechanisms_count));
          return;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_00155bb9;
        pcVar4 = "SASL challenge received in a bad state: %s%s (%d)";
        iVar2 = 0x327;
      }
      else {
        _Var1 = is_sasl_outcome_type_by_descriptor(pAVar3);
        if (!_Var1) {
          UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
          if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) {
            return;
          }
          (*UNRECOVERED_JUMPTABLE)
                    (AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                     ,"on_sasl_frame_received_callback",0x3a2,1,"Bad SASL frame");
          return;
        }
        if ((*(int *)((long)context + 0x4c) == 3) || (*(int *)((long)context + 0x4c) == 5)) {
          *(undefined4 *)((long)context + 0x4c) = 6;
          iVar2 = amqpvalue_get_sasl_outcome
                            (sasl_frame,(SASL_OUTCOME_HANDLE *)&sasl_server_mechanism_name);
          if (iVar2 != 0) {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_001557d2;
            pcVar4 = "Cannot get SASL outcome";
            iVar2 = 0x373;
LAB_001557cd:
            (*UNRECOVERED_JUMPTABLE)
                      (AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                       ,"on_sasl_frame_received_callback",iVar2,1,pcVar4);
LAB_001557d2:
            handle_error((SASL_CLIENT_IO_INSTANCE *)context);
            return;
          }
          iVar2 = sasl_outcome_get_code
                            ((SASL_OUTCOME_HANDLE)sasl_server_mechanism_name,
                             (sasl_code *)&sasl_mechanisms_handle);
          if (iVar2 == 0) {
            if ((char)sasl_mechanisms_handle == '\0') {
              *(undefined4 *)((long)context + 0x68) = 3;
              if (*(code **)((long)context + 0x10) != (code *)0x0) {
                (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x30),1);
              }
              goto LAB_00155c1c;
            }
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar4 = "SASL handshake failed with code %02X";
              iVar2 = 0x38d;
              goto LAB_00155c0f;
            }
          }
          else {
            UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
            if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
              pcVar4 = "Cannot get SASL outcome code";
              iVar2 = 0x37d;
LAB_00155c0f:
              (*UNRECOVERED_JUMPTABLE)
                        (AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
                         ,"on_sasl_frame_received_callback",iVar2,1,pcVar4);
            }
          }
          handle_error((SASL_CLIENT_IO_INSTANCE *)context);
LAB_00155c1c:
          sasl_outcome_destroy((SASL_OUTCOME_HANDLE)sasl_server_mechanism_name);
          return;
        }
        UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
        if (UNRECOVERED_JUMPTABLE == (LOGGER_LOG)0x0) goto LAB_00155bb9;
        pcVar4 = "SASL outcome received in a bad state: %s%s (%d)";
        iVar2 = 0x368;
      }
    }
  }
  (*UNRECOVERED_JUMPTABLE)
            (AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/saslclientio.c"
             ,"on_sasl_frame_received_callback",iVar2,1,pcVar4);
LAB_00155bb9:
  handle_error((SASL_CLIENT_IO_INSTANCE *)context);
  return;
}

Assistant:

static void on_sasl_frame_received_callback(void* context, AMQP_VALUE sasl_frame)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    /* Codes_SRS_SASLCLIENTIO_01_067: [The SASL frame exchange shall be started as soon as the SASL header handshake is done.] */
    switch (sasl_client_io_instance->io_state)
    {
    default:
        LogError("SASL frame received while in state %d", (int)sasl_client_io_instance->io_state);
        break;

    case IO_STATE_OPEN:
    case IO_STATE_OPENING_UNDERLYING_IO:
    case IO_STATE_CLOSING:
        /* Codes_SRS_SASLCLIENTIO_01_117: [If `on_sasl_frame_received_callback` is called when the state of the IO is OPEN then the `on_io_error` callback shall be triggered.]*/
        handle_error(sasl_client_io_instance);
        break;

    case IO_STATE_SASL_HANDSHAKE:
        if (sasl_client_io_instance->sasl_header_exchange_state != SASL_HEADER_EXCHANGE_HEADER_EXCH)
        {
            /* Codes_SRS_SASLCLIENTIO_01_118: [If `on_sasl_frame_received_callback` is called in the OPENING state but the header exchange has not yet been completed, then the `on_io_error` callback shall be triggered.]*/
            handle_error(sasl_client_io_instance);
        }
        else
        {
            AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(sasl_frame);
            if (descriptor == NULL)
            {
                /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                LogError("Could not obtain SASL frame descriptor");
                handle_error(sasl_client_io_instance);
            }
            else
            {
                if (sasl_client_io_instance->is_trace_on != 0)
                {
                    log_incoming_frame(sasl_frame);
                }

                /* Codes_SRS_SASLCLIENTIO_01_032: [The peer acting as the SASL server MUST announce supported authentication mechanisms using the sasl-mechanisms frame.] */
                /* Codes_SRS_SASLCLIENTIO_01_040: [The peer playing the role of the SASL client and the peer playing the role of the SASL server MUST correspond to the TCP client and server respectively.] */
                /* Codes_SRS_SASLCLIENTIO_01_034: [<-- SASL-MECHANISMS] */
                if (is_sasl_mechanisms_type_by_descriptor(descriptor))
                {
                    switch (sasl_client_io_instance->sasl_client_negotiation_state)
                    {
                    default:
                        LogError("SASL mechanisms frame received in %" PRI_MU_ENUM " state", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, sasl_client_io_instance->sasl_client_negotiation_state));
                        handle_error(sasl_client_io_instance);
                        break;

                    case SASL_CLIENT_NEGOTIATION_NOT_STARTED:
                    {
                        SASL_MECHANISMS_HANDLE sasl_mechanisms_handle;

                        if (amqpvalue_get_sasl_mechanisms(sasl_frame, &sasl_mechanisms_handle) != 0)
                        {
                            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                            LogError("Could not get SASL mechanisms");
                            handle_error(sasl_client_io_instance);
                        }
                        else
                        {
                            AMQP_VALUE sasl_server_mechanisms;
                            uint32_t mechanisms_count;

                            if ((sasl_mechanisms_get_sasl_server_mechanisms(sasl_mechanisms_handle, &sasl_server_mechanisms) != 0) ||
                                (amqpvalue_get_array_item_count(sasl_server_mechanisms, &mechanisms_count) != 0) ||
                                (mechanisms_count == 0))
                            {
                                /* Codes_SRS_SASLCLIENTIO_01_042: [It is invalid for this list to be null or empty.] */
                                LogError("Invalid SASL mechanisms list");
                                handle_error(sasl_client_io_instance);
                            }
                            else
                            {
                                const char* sasl_mechanism_name = saslmechanism_get_mechanism_name(sasl_client_io_instance->sasl_mechanism);
                                if (sasl_mechanism_name == NULL)
                                {
                                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                    LogError("Cannot get the mechanism name");
                                    handle_error(sasl_client_io_instance);
                                }
                                else
                                {
                                    uint32_t i;

                                    for (i = 0; i < mechanisms_count; i++)
                                    {
                                        AMQP_VALUE sasl_server_mechanism;
                                        sasl_server_mechanism = amqpvalue_get_array_item(sasl_server_mechanisms, i);
                                        if (sasl_server_mechanism == NULL)
                                        {
                                            LogError("Cannot get SASL mechanisms array item for index %u", (unsigned int)i);
                                            i = mechanisms_count;
                                        }
                                        else
                                        {
                                            const char* sasl_server_mechanism_name;
                                            if (amqpvalue_get_symbol(sasl_server_mechanism, &sasl_server_mechanism_name) != 0)
                                            {
                                                LogError("Error getting server SASL mechanism from array item");
                                                i = mechanisms_count;
                                            }
                                            else
                                            {
                                                if (strcmp(sasl_mechanism_name, sasl_server_mechanism_name) == 0)
                                                {
                                                    amqpvalue_destroy(sasl_server_mechanism);
                                                    break;
                                                }
                                            }

                                            amqpvalue_destroy(sasl_server_mechanism);
                                        }
                                    }

                                    if (i == mechanisms_count)
                                    {
                                        /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                        LogError("Could not find desired SASL mechanism in the list presented by server");
                                        handle_error(sasl_client_io_instance);
                                    }
                                    else
                                    {
                                        sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_MECH_RCVD;

                                        /* Codes_SRS_SASLCLIENTIO_01_035: [SASL-INIT -->] */
                                        /* Codes_SRS_SASLCLIENTIO_01_033: [The partner MUST then choose one of the supported mechanisms and initiate a sasl exchange.] */
                                        /* Codes_SRS_SASLCLIENTIO_01_054: [Selects the sasl mechanism and provides the initial response if needed.] */
                                        if (send_sasl_init(sasl_client_io_instance, sasl_mechanism_name) != 0)
                                        {
                                            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                            LogError("Could not send SASL init");
                                            handle_error(sasl_client_io_instance);
                                        }
                                        else
                                        {
                                            sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_INIT_SENT;
                                        }
                                    }
                                }
                            }

                            sasl_mechanisms_destroy(sasl_mechanisms_handle);
                        }

                        break;
                    }
                    }
                }
                /* Codes_SRS_SASLCLIENTIO_01_052: [Send the SASL challenge data as defined by the SASL specification.] */
                /* Codes_SRS_SASLCLIENTIO_01_036: [<-- SASL-CHALLENGE *] */
                /* Codes_SRS_SASLCLIENTIO_01_039: [the SASL challenge/response step can occur zero or more times depending on the details of the SASL mechanism chosen.] */
                else if (is_sasl_challenge_type_by_descriptor(descriptor))
                {
                    /* Codes_SRS_SASLCLIENTIO_01_032: [The peer acting as the SASL server MUST announce supported authentication mechanisms using the sasl-mechanisms frame.] */
                    if ((sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_INIT_SENT) &&
                        (sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_RESPONSE_SENT))
                    {
                        LogError("SASL challenge received in a bad state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, sasl_client_io_instance->sasl_client_negotiation_state));
                        handle_error(sasl_client_io_instance);
                    }
                    else
                    {
                        SASL_CHALLENGE_HANDLE sasl_challenge_handle;

                        if (amqpvalue_get_sasl_challenge(sasl_frame, &sasl_challenge_handle) != 0)
                        {
                            /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                            LogError("Cannot get SASL challenge values");
                            handle_error(sasl_client_io_instance);
                        }
                        else
                        {
                            amqp_binary challenge_binary_value;

                            challenge_binary_value.bytes = NULL;
                            challenge_binary_value.length = 0;

                            /* Codes_SRS_SASLCLIENTIO_01_053: [Challenge information, a block of opaque binary data passed to the security mechanism.] */
                            if (sasl_challenge_get_challenge(sasl_challenge_handle, &challenge_binary_value) != 0)
                            {
                                /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                LogError("Cannot get SASL challenge binary value");
                                handle_error(sasl_client_io_instance);
                            }
                            else
                            {
                                SASL_MECHANISM_BYTES challenge;
                                SASL_MECHANISM_BYTES response_bytes;

                                challenge.bytes = challenge_binary_value.bytes;
                                challenge.length = challenge_binary_value.length;
                                response_bytes.bytes = NULL;
                                response_bytes.length = 0;

                                /* Codes_SRS_SASLCLIENTIO_01_057: [The contents of this data are defined by the SASL security mechanism.] */
                                /* Codes_SRS_SASLCLIENTIO_01_037: [SASL-RESPONSE -->] */
                                if (saslmechanism_challenge(sasl_client_io_instance->sasl_mechanism, &challenge, &response_bytes) != 0)
                                {
                                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                    LogError("SASL Challenge failed");
                                    handle_error(sasl_client_io_instance);
                                }
                                else if (send_sasl_response(sasl_client_io_instance, response_bytes) != 0)
                                {
                                    /* Codes_SRS_SASLCLIENTIO_01_119: [If any error is encountered when parsing the received frame, the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                                    LogError("Cannot send SASL response");
                                    handle_error(sasl_client_io_instance);
                                }
                            }

                            sasl_challenge_destroy(sasl_challenge_handle);
                        }
                    }
                }
                /* Codes_SRS_SASLCLIENTIO_01_058: [This frame indicates the outcome of the SASL dialog.] */
                /* Codes_SRS_SASLCLIENTIO_01_038: [<-- SASL-OUTCOME] */
                else if (is_sasl_outcome_type_by_descriptor(descriptor))
                {
                    /* Codes_SRS_SASLCLIENTIO_01_032: [The peer acting as the SASL server MUST announce supported authentication mechanisms using the sasl-mechanisms frame.] */
                    if ((sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_INIT_SENT) &&
                        (sasl_client_io_instance->sasl_client_negotiation_state != SASL_CLIENT_NEGOTIATION_RESPONSE_SENT))
                    {
                        LogError("SASL outcome received in a bad state: %" PRI_MU_ENUM "", MU_ENUM_VALUE(SASL_CLIENT_NEGOTIATION_STATE, sasl_client_io_instance->sasl_client_negotiation_state));
                        handle_error(sasl_client_io_instance);
                    }
                    else
                    {
                        SASL_OUTCOME_HANDLE sasl_outcome;

                        sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_OUTCOME_RCVD;

                        if (amqpvalue_get_sasl_outcome(sasl_frame, &sasl_outcome) != 0)
                        {
                            LogError("Cannot get SASL outcome");
                            handle_error(sasl_client_io_instance);
                        }
                        else
                        {
                            sasl_code sasl_code;

                            /* Codes_SRS_SASLCLIENTIO_01_060: [A reply-code indicating the outcome of the SASL dialog.] */
                            if (sasl_outcome_get_code(sasl_outcome, &sasl_code) != 0)
                            {
                                LogError("Cannot get SASL outcome code");
                                handle_error(sasl_client_io_instance);
                            }
                            else
                            {
                                switch (sasl_code)
                                {
                                default:
                                case sasl_code_auth:
                                    /* Codes_SRS_SASLCLIENTIO_01_063: [1 Connection authentication failed due to an unspecified problem with the supplied credentials.] */
                                case sasl_code_sys:
                                    /* Codes_SRS_SASLCLIENTIO_01_064: [2 Connection authentication failed due to a system error.] */
                                case sasl_code_sys_perm:
                                    /* Codes_SRS_SASLCLIENTIO_01_065: [3 Connection authentication failed due to a system error that is unlikely to be corrected without intervention.] */
                                case sasl_code_sys_temp:
                                    /* Codes_SRS_SASLCLIENTIO_01_066: [4 Connection authentication failed due to a transient system error.] */
                                    LogError("SASL handshake failed with code %02X", (unsigned char)sasl_code);
                                    handle_error(sasl_client_io_instance);
                                    break;

                                case sasl_code_ok:
                                    /* Codes_SRS_SASLCLIENTIO_01_059: [Upon successful completion of the SASL dialog the security layer has been established] */
                                    /* Codes_SRS_SASLCLIENTIO_01_062: [0 Connection authentication succeeded.]  */
                                    sasl_client_io_instance->io_state = IO_STATE_OPEN;

                                    /* Codes_SRS_SASLCLIENTIO_01_072: [When the SASL handshake is complete, if the handshake is successful, the SASL client IO state shall be switched to `IO_STATE_OPEN` and the `on_io_open_complete` callback shall be called with `IO_OPEN_OK`.]*/
                                    indicate_open_complete(sasl_client_io_instance, IO_OPEN_OK);
                                    break;
                                }
                            }

                            sasl_outcome_destroy(sasl_outcome);
                        }
                    }
                }
                else
                {
                    LogError("Bad SASL frame");
                }
            }
        }
        break;
    }
}